

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimersRegistry.cpp
# Opt level: O3

void __thiscall TimersRegistry::TraceAll(TimersRegistry *this)

{
  _Rb_tree_node_base *this_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  Trace *pTVar3;
  _Rb_tree_node_base *p_Var4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  p_Var4 = (this->mTimers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pTVar3 = Trace::DefaultTrace();
  Trace::TraceToLog(pTVar3,"Start Tracing Timers");
  for (; (_Rb_tree_header *)p_Var4 != &(this->mTimers)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    this_00 = p_Var4 + 2;
    dVar5 = Timer::GetTotalMiliSeconds((Timer *)this_00);
    dVar6 = Timer::GetTotalMiliSeconds((Timer *)this_00);
    auVar1 = SEXT816((long)dVar6) * SEXT816(0x4a90be587de6e565);
    dVar7 = Timer::GetTotalMiliSeconds((Timer *)this_00);
    auVar2 = SEXT816((long)dVar7) * SEXT816(0x45e7b272f608770f);
    dVar8 = Timer::GetTotalMiliSeconds((Timer *)this_00);
    pTVar3 = Trace::DefaultTrace();
    Trace::TraceToLog(pTVar3,"Tracing Timer %s. total time [h:m:s:ms] = %ld:%ld:%ld:%ld",
                      *(undefined8 *)(p_Var4 + 1),(long)dVar5 / 3600000,
                      (long)(((int)(long)dVar6 +
                             ((int)(auVar1._8_8_ >> 0x14) - (auVar1._12_4_ >> 0x1f)) * -3600000) /
                            60000),
                      (long)(((int)(long)dVar7 +
                             ((int)(auVar2._8_8_ >> 0xe) - (auVar2._12_4_ >> 0x1f)) * -60000) / 1000
                            ),(long)dVar8 % 1000);
  }
  pTVar3 = Trace::DefaultTrace();
  Trace::TraceToLog(pTVar3,"End Tracing Timers");
  return;
}

Assistant:

void TimersRegistry::TraceAll()
{
	StringToTimerMap::iterator it = mTimers.begin();
	
	TRACE_LOG("Start Tracing Timers");
	for(; it != mTimers.end(); ++it)
	{
		long hours = (long)it->second.GetTotalMiliSeconds()/3600000;
		long minutes = ((long)it->second.GetTotalMiliSeconds()%3600000) / 60000;
		long seconds = ((long)it->second.GetTotalMiliSeconds()%60000) / 1000;
		long miliseconds = (long)it->second.GetTotalMiliSeconds()%1000;
		TRACE_LOG5("Tracing Timer %s. total time [h:m:s:ms] = %ld:%ld:%ld:%ld",
						it->first.c_str(),hours,minutes,seconds,miliseconds);
	}
	TRACE_LOG("End Tracing Timers");
}